

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blackboard.cpp
# Opt level: O2

Entry * __thiscall
cali::Blackboard::exchange
          (Entry *__return_storage_ptr__,Blackboard *this,cali_id_t key,Entry *value,
          bool include_in_snapshots)

{
  uint64_t uVar1;
  size_t sVar2;
  
  sVar2 = find_existing_entry(this,key);
  (__return_storage_ptr__->m_value).m_v.value.v_uint = 0;
  __return_storage_ptr__->m_node = (Node *)0x0;
  (__return_storage_ptr__->m_value).m_v.type_and_size = 0;
  if (this->hashtable[sVar2].key == key) {
    (__return_storage_ptr__->m_value).m_v.value = this->hashtable[sVar2].value.m_value.m_v.value;
    uVar1 = this->hashtable[sVar2].value.m_value.m_v.type_and_size;
    __return_storage_ptr__->m_node = this->hashtable[sVar2].value.m_node;
    (__return_storage_ptr__->m_value).m_v.type_and_size = uVar1;
    uVar1 = (value->m_value).m_v.type_and_size;
    this->hashtable[sVar2].value.m_node = value->m_node;
    this->hashtable[sVar2].value.m_value.m_v.type_and_size = uVar1;
    this->hashtable[sVar2].value.m_value.m_v.value = (value->m_value).m_v.value;
  }
  else {
    add(this,key,value,include_in_snapshots);
  }
  LOCK();
  (this->ucount).super___atomic_base<int>._M_i = (this->ucount).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return __return_storage_ptr__;
}

Assistant:

Entry Blackboard::exchange(cali_id_t key, const Entry& value, bool include_in_snapshots)
{
    size_t I = find_existing_entry(key);
    Entry  ret;

    if (hashtable[I].key == key) {
        ret                = hashtable[I].value;
        hashtable[I].value = value;
    } else
        add(key, value, include_in_snapshots);

    ++ucount;

    return ret;
}